

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O0

bool __thiscall
OpenMD::ifstrstream::internalOpen(ifstrstream *this,char *filename,openmode mode,bool param_4)

{
  long lVar1;
  _Ios_Openmode in_ESI;
  long *in_RDI;
  
  lVar1 = std::filebuf::open((char *)(in_RDI + 0xf),in_ESI);
  if (lVar1 != 0) {
    std::ios::clear((int)in_RDI + (int)*(undefined8 *)(*in_RDI + -0x18));
  }
  else {
    std::ios::setstate((int)in_RDI + (int)*(undefined8 *)(*in_RDI + -0x18));
  }
  return lVar1 != 0;
}

Assistant:

bool ifstrstream::internalOpen(const char* filename,
                                 std::ios_base::openmode mode, bool) {
    // in single version, fall back to ifstream
    if (!internalFileBuf_.open(filename, mode)) {
      this->setstate(std::ios_base::failbit);
      return false;
    }

    this->clear();
    return true;
  }